

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

RecyclableObject * __thiscall
Js::JavascriptProxy::ToObject(JavascriptProxy *this,ScriptContext *requestContext)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  ThreadContext *threadContext;
  ScriptContext *requestContext_local;
  JavascriptProxy *this_local;
  
  bVar1 = IsRevoked(this);
  if (bVar1) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_00 = ScriptContext::GetThreadContext(pSVar2);
    bVar1 = ThreadContext::RecordImplicitException(this_00);
    if (bVar1) {
      pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea15,L"toObject");
    }
    this_local = (JavascriptProxy *)0x0;
  }
  else {
    this_local = (JavascriptProxy *)
                 RecyclableObject::ToObject((RecyclableObject *)this,requestContext);
  }
  return (RecyclableObject *)this_local;
}

Assistant:

RecyclableObject* JavascriptProxy::ToObject(ScriptContext * requestContext)
    {
        //RecyclableObject* targetObj;
        if (IsRevoked())
        {
            ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return nullptr;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("toObject"));
        }
        return __super::ToObject(requestContext);
    }